

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStrategy.cpp
# Opt level: O0

int __thiscall
SimpleStrategy::countCalls
          (SimpleStrategy *this,
          set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *calls)

{
  bool bVar1;
  reference pCVar2;
  size_type sVar3;
  undefined1 local_78 [8];
  Call c;
  iterator __end1;
  iterator __begin1;
  set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *__range1;
  int total;
  set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *calls_local;
  SimpleStrategy *this_local;
  
  __range1._4_4_ = 0;
  __end1 = std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>::begin
                     (calls);
  c.calls._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>::
               end(calls);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&c.calls._M_t._M_impl.super__Rb_tree_header.
                                              _M_node_count);
    if (!bVar1) break;
    pCVar2 = std::_Rb_tree_const_iterator<CfgData::Call>::operator*(&__end1);
    CfgData::Call::Call((Call *)local_78,pCVar2);
    sVar3 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                      ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)&c.block_addr);
    __range1._4_4_ = __range1._4_4_ + (int)sVar3;
    CfgData::Call::~Call((Call *)local_78);
    std::_Rb_tree_const_iterator<CfgData::Call>::operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

int SimpleStrategy::countCalls(const std::set<CfgData::Call>& calls) {
	int total = 0;
	for (CfgData::Call c : calls)
		total += c.calls.size();

	return total;
}